

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsigc++.h
# Opt level: O2

intrusive_ptr<sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>_> __thiscall
sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>::create
          (functorn_2<void,_unsigned_int,_bool,_int,_void_*> *this,functor_t *fb,uint _a1,bool _a2)

{
  atomic<unsigned_int> *paVar1;
  functor_base<void,_int,_void_*,_unsigned_int,_bool> *pfVar2;
  _func_int **pp_Var3;
  
  pp_Var3 = (_func_int **)operator_new(0x20);
  *(undefined4 *)(pp_Var3 + 1) = 0;
  *pp_Var3 = (_func_int *)&PTR__functorn_2_0010dcc8;
  pfVar2 = fb->px;
  pp_Var3[2] = (_func_int *)pfVar2;
  if (pfVar2 != (functor_base<void,_int,_void_*,_unsigned_int,_bool> *)0x0) {
    LOCK();
    paVar1 = &(pfVar2->super_functor_refcnt).m_refCount;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  *(uint *)(pp_Var3 + 3) = _a1;
  *(bool *)((long)pp_Var3 + 0x1c) = _a2;
  (this->super_functor_base<void,_int,_void_*>).super_functor_refcnt._vptr_functor_refcnt = pp_Var3;
  LOCK();
  *(int *)(pp_Var3 + 1) = *(int *)(pp_Var3 + 1) + 1;
  UNLOCK();
  return (intrusive_ptr<sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>_>)this;
}

Assistant:

static boost::intrusive_ptr<functorn_2> create(const functor_t &fb, A1 _a1, A2 _a2) {
        return new functorn_2(fb, _a1, _a2);
    }